

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O3

void __thiscall
gl3cts::TransformFeedback::DiscardVertex::DiscardVertex
          (DiscardVertex *this,Context *context,char *test_name,char *test_description)

{
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,test_name,test_description);
  (this->super_CaptureVertexInterleaved).super_TestCase.m_context = context;
  (this->super_CaptureVertexInterleaved).m_context = context;
  (this->super_CaptureVertexInterleaved).m_program = 0;
  (this->super_CaptureVertexInterleaved).m_framebuffer = 0;
  (this->super_CaptureVertexInterleaved).m_renderbuffer = 0;
  (this->super_CaptureVertexInterleaved).m_buffer = 0;
  (this->super_CaptureVertexInterleaved).m_buffer = 0;
  (this->super_CaptureVertexInterleaved).m_buffer_size = 0;
  (this->super_CaptureVertexInterleaved).m_vertex_array_object = 0;
  (this->super_CaptureVertexInterleaved).m_max_transform_feedback_components = 0;
  (this->super_CaptureVertexInterleaved).m_attrib_type = 0x8c8c;
  (this->super_CaptureVertexInterleaved).m_max_vertices_drawn = 8;
  (this->super_CaptureVertexInterleaved).m_glBindBufferOffsetEXT =
       (BindBufferOffsetEXT_ProcAddress)0x0;
  (this->super_CaptureVertexInterleaved).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
       = (_func_int **)&PTR__CaptureVertexInterleaved_020c1ca8;
  return;
}

Assistant:

gl3cts::TransformFeedback::DiscardVertex::DiscardVertex(deqp::Context& context, const char* test_name,
														const char* test_description)
	: CaptureVertexInterleaved(context, test_name, test_description)
{
}